

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O0

c_v64 c_v64_shuffle_8(c_v64 a,c_v64 pattern)

{
  int c;
  c_v64 t;
  uint local_1c;
  byte local_18 [8];
  uint8_t local_10 [8];
  c_v64 local_8;
  
  local_1c = 0;
  while( true ) {
    if (7 < (int)local_1c) {
      return (c_v64)local_8.u64;
    }
    if ((local_18[(int)local_1c] & 0xf8) != 0) break;
    local_8.u8[(int)local_1c] = local_10[(int)(local_18[(int)local_1c] & 7)];
    local_1c = local_1c + 1;
  }
  fprintf(_stderr,"Error: Undefined v64_shuffle_8 index %d/%d\n",(ulong)local_18[(int)local_1c],
          (ulong)local_1c);
  abort();
}

Assistant:

SIMD_INLINE c_v64 c_v64_shuffle_8(c_v64 a, c_v64 pattern) {
  c_v64 t;
  int c;
  for (c = 0; c < 8; c++) {
    if (SIMD_CHECK && (pattern.u8[c] & ~7)) {
      fprintf(stderr, "Error: Undefined v64_shuffle_8 index %d/%d\n",
              pattern.u8[c], c);
      abort();
    }
    t.u8[c] =
        a.u8[CONFIG_BIG_ENDIAN ? 7 - (pattern.u8[c] & 7) : pattern.u8[c] & 7];
  }
  return t;
}